

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttkern.c
# Opt level: O3

FT_Int tt_face_get_kerning(TT_Face face,FT_UInt left_glyph,FT_UInt right_glyph)

{
  FT_UInt count2;
  uint uVar1;
  FT_Byte *pFVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  FT_Byte *pFVar7;
  FT_Byte *pFVar8;
  FT_UInt FVar9;
  FT_ULong key0;
  ulong uVar10;
  uint *puVar11;
  ulong uVar12;
  FT_Byte *pFVar13;
  ulong uVar14;
  
  FVar9 = face->num_kern_tables;
  iVar3 = 0;
  if (9 < (long)face->kern_table_size && FVar9 != 0) {
    pFVar13 = face->kern_table;
    pFVar8 = pFVar13 + face->kern_table_size;
    pFVar2 = pFVar13 + 10;
    uVar10 = (ulong)right_glyph | (ulong)left_glyph << 0x10;
    uVar4 = 1;
    iVar3 = 0;
    pFVar13 = pFVar13 + 4;
    do {
      pFVar7 = pFVar13 + (ushort)(*(ushort *)(pFVar13 + 2) << 8 | *(ushort *)(pFVar13 + 2) >> 8);
      if (pFVar8 < pFVar13 + (ushort)(*(ushort *)(pFVar13 + 2) << 8 | *(ushort *)(pFVar13 + 2) >> 8)
         ) {
        pFVar7 = pFVar8;
      }
      if (((face->kern_avail_bits & uVar4) != 0) && (pFVar13[4] == '\0')) {
        puVar11 = (uint *)(pFVar13 + 0xe);
        uVar1 = (uint)(((long)pFVar7 - (long)puVar11) / 6);
        if ((long)(ulong)((uint)CONCAT11(*pFVar2,pFVar13[7]) * 6) <= (long)pFVar7 - (long)puVar11) {
          uVar1 = (uint)CONCAT11(*pFVar2,pFVar13[7]);
        }
        if ((face->kern_order_bits & uVar4) == 0) {
          for (; uVar1 != 0; uVar1 = uVar1 - 1) {
            uVar6 = *puVar11;
            if ((uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18) ==
                uVar10) goto LAB_00160509;
            puVar11 = (uint *)((long)puVar11 + 6);
          }
        }
        else if (uVar1 != 0) {
          uVar6 = 0;
LAB_001604b3:
          uVar14 = (ulong)((uVar1 + uVar6 & 0xfffffffe) * 3);
          uVar5 = *(uint *)((long)puVar11 + uVar14);
          uVar12 = (ulong)(uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                          uVar5 << 0x18);
          if (uVar12 != uVar10) goto code_r0x001604ce;
          puVar11 = (uint *)((long)puVar11 + uVar14);
LAB_00160509:
          if ((pFVar13[5] & 8) != 0) {
            iVar3 = 0;
          }
          iVar3 = iVar3 + ((int)(short)((ushort)(byte)puVar11[1] << 8) |
                          (uint)*(byte *)((long)puVar11 + 5));
        }
      }
LAB_00160445:
      FVar9 = FVar9 - 1;
      if (FVar9 == 0) {
        return iVar3;
      }
      uVar4 = uVar4 * 2;
      pFVar2 = pFVar7 + 6;
      pFVar13 = pFVar7;
    } while (pFVar2 <= pFVar8);
  }
  return iVar3;
code_r0x001604ce:
  uVar5 = uVar1 + uVar6 >> 1;
  if (uVar12 < uVar10) {
    uVar6 = uVar5 + 1;
    uVar5 = uVar1;
  }
  uVar1 = uVar5;
  if (uVar1 <= uVar6) goto LAB_00160445;
  goto LAB_001604b3;
}

Assistant:

FT_LOCAL_DEF( FT_Int )
  tt_face_get_kerning( TT_Face  face,
                       FT_UInt  left_glyph,
                       FT_UInt  right_glyph )
  {
    FT_Int    result = 0;
    FT_UInt   count, mask;
    FT_Byte*  p       = face->kern_table;
    FT_Byte*  p_limit = p + face->kern_table_size;


    p   += 4;
    mask = 0x0001;

    for ( count = face->num_kern_tables;
          count > 0 && p + 6 <= p_limit;
          count--, mask <<= 1 )
    {
      FT_Byte* base     = p;
      FT_Byte* next;
      FT_UInt  version  = FT_NEXT_USHORT( p );
      FT_UInt  length   = FT_NEXT_USHORT( p );
      FT_UInt  coverage = FT_NEXT_USHORT( p );
      FT_UInt  num_pairs;
      FT_Int   value    = 0;

      FT_UNUSED( version );


      next = base + length;

      if ( next > p_limit )  /* handle broken table */
        next = p_limit;

      if ( ( face->kern_avail_bits & mask ) == 0 )
        goto NextTable;

      FT_ASSERT( p + 8 <= next ); /* tested in tt_face_load_kern */

      num_pairs = FT_NEXT_USHORT( p );
      p        += 6;

      if ( ( next - p ) < 6 * (int)num_pairs )  /* handle broken count  */
        num_pairs = (FT_UInt)( ( next - p ) / 6 );

      switch ( coverage >> 8 )
      {
      case 0:
        {
          FT_ULong  key0 = TT_KERN_INDEX( left_glyph, right_glyph );


          if ( face->kern_order_bits & mask )   /* binary search */
          {
            FT_UInt   min = 0;
            FT_UInt   max = num_pairs;


            while ( min < max )
            {
              FT_UInt   mid = ( min + max ) >> 1;
              FT_Byte*  q   = p + 6 * mid;
              FT_ULong  key;


              key = FT_NEXT_ULONG( q );

              if ( key == key0 )
              {
                value = FT_PEEK_SHORT( q );
                goto Found;
              }
              if ( key < key0 )
                min = mid + 1;
              else
                max = mid;
            }
          }
          else /* linear search */
          {
            FT_UInt  count2;


            for ( count2 = num_pairs; count2 > 0; count2-- )
            {
              FT_ULong  key = FT_NEXT_ULONG( p );


              if ( key == key0 )
              {
                value = FT_PEEK_SHORT( p );
                goto Found;
              }
              p += 2;
            }
          }
        }
        break;

       /*
        *  We don't support format 2 because we haven't seen a single font
        *  using it in real life...
        */

      default:
        ;
      }

      goto NextTable;

    Found:
      if ( coverage & 8 ) /* override or add */
        result = value;
      else
        result += value;

    NextTable:
      p = next;
    }

    return result;
  }